

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,DomeLight *light,uint32_t indent,
          bool closing_brace)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  uint indent_00;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint indent_01;
  stringstream ss;
  allocator local_211;
  string local_210;
  uint32_t local_1ec;
  string local_1e8;
  pprint *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1ec = indent;
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),n);
  poVar3 = std::operator<<(local_1a8,(string *)&local_210);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(this + 0x108),s);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3," DomeLight \"");
  poVar3 = std::operator<<(poVar3,(string *)(this + 0xe8));
  std::operator<<(poVar3,"\"\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x1ac8));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),n_00);
    poVar3 = std::operator<<(local_1a8,(string *)&local_210);
    std::operator<<(poVar3,"(\n");
    std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_210,this + 0x1ac8,(PrimMeta *)(ulong)((int)light + 1),indent)
    ;
    std::operator<<(local_1a8,(string *)&local_210);
    std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),n_01);
    poVar3 = std::operator<<(local_1a8,(string *)&local_210);
    std::operator<<(poVar3,")\n");
    std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_01 = (int)light + 1;
  local_1c8 = (pprint *)((ulong)light & 0xffffffff);
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)light & 0xffffffff),n_02);
  poVar3 = std::operator<<(local_1a8,(string *)&local_210);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:color",&local_211);
  print_typed_attr<tinyusdz::value::color3f>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0x5d8),&local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:colorTemperature",&local_211);
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x870),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:diffuse",&local_211);
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0xaf8),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:enableColorTemperature",&local_211);
  print_typed_attr<bool>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)(this + 0xd80),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:exposure",&local_211);
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1008),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:intensity",&local_211);
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1290),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:normalize",&local_211);
  print_typed_attr<bool>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)(this + 0x1518),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:specular",&local_211);
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x17a0),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:guideRadius",&local_211);
  print_typed_attr<float>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1ef0),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:file",&local_211);
  print_typed_attr<tinyusdz::value::AssetPath>
            (&local_210,
             (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)(this + 0x2178),
             &local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:textureFormat",&local_211);
  print_typed_token_attr<tinyusdz::DomeLight::TextureFormat>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::DomeLight::TextureFormat>_>
              *)(this + 0x2418),&local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"visibility",&local_211);
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
             (this + 0x118),&local_1e8,indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_1e8,"purpose",&local_211);
  indent_00 = indent_01;
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_210,(TypedAttributeWithFallback<tinyusdz::Purpose> *)(this + 0x3a0),&local_1e8,
             indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  print_xformOps_abi_cxx11_
            (&local_210,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent_01,
             indent_00);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1a98),indent_01);
  std::operator<<(local_1a8,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  if ((char)local_1ec != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,local_1c8,n_03);
    poVar3 = std::operator<<(local_1a8,(string *)&local_210);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::_M_dispose();
  }
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string to_string(const DomeLight &light, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(light.spec) << " DomeLight \""
     << light.name << "\"\n";
  if (light.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(light.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(light.color, "inputs:color", indent + 1);
  ss << print_typed_attr(light.colorTemperature, "inputs:colorTemperature",
                         indent + 1);
  ss << print_typed_attr(light.diffuse, "inputs:diffuse", indent + 1);
  ss << print_typed_attr(light.enableColorTemperature,
                         "inputs:enableColorTemperature", indent + 1);
  ss << print_typed_attr(light.exposure, "inputs:exposure", indent + 1);
  ss << print_typed_attr(light.intensity, "inputs:intensity", indent + 1);
  ss << print_typed_attr(light.normalize, "inputs:normalize", indent + 1);
  ss << print_typed_attr(light.specular, "inputs:specular", indent + 1);

  ss << print_typed_attr(light.guideRadius, "inputs:guideRadius", indent + 1);
  ss << print_typed_attr(light.file, "inputs:file", indent + 1);
  ss << print_typed_token_attr(light.textureFormat, "inputs:textureFormat",
                               indent + 1);

  //ss << print_typed_attr(light.extent, "extent", indent + 1);
  ss << print_typed_token_attr(light.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(light.purpose, "purpose", indent + 1);

  ss << print_xformOps(light.xformOps, indent + 1);

  ss << print_props(light.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}